

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  expected<InitList,_char> *item;
  ForNonContainerNonPointer<nonstd::expected_lite::expected<InitList,_char>,_std::string> local_40;
  bool local_19;
  expression_lhs *local_18;
  expression_lhs<const_nonstd::expected_lite::expected<InitList,_char>_&> *this_local;
  
  local_18 = this;
  this_local = (expression_lhs<const_nonstd::expected_lite::expected<InitList,_char>_&> *)
               __return_storage_ptr__;
  local_19 = nonstd::expected_lite::expected::operator_cast_to_bool(*(expected **)this);
  to_string<nonstd::expected_lite::expected<InitList,char>>(&local_40,*(lest **)this,item);
  result::result<bool>(__return_storage_ptr__,&local_19,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }